

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

void ucnv_getAliases_63(char *alias,char **aliases,UErrorCode *pErrorCode)

{
  ushort *puVar1;
  ushort uVar2;
  uint16_t *puVar3;
  UBool UVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  UVar4 = haveAliasData(pErrorCode);
  if (UVar4 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      uVar5 = findConverter(alias,(UBool *)0x0,pErrorCode);
      puVar3 = gMainTable.stringTable;
      if ((uVar5 < gMainTable.converterListSize) &&
         ((ulong)gMainTable.taggedAliasArray
                 [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar5] != 0)) {
        puVar1 = gMainTable.taggedAliasLists +
                 gMainTable.taggedAliasArray
                 [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar5];
        uVar2 = *puVar1;
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          aliases[uVar6] = (char *)(puVar3 + puVar1[uVar6 + 1]);
        }
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_getAliases(const char *alias, const char **aliases, UErrorCode *pErrorCode)
{
    ucnv_io_getAliases(alias, 0, aliases, pErrorCode);
}